

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

XXH_errorcode XXH32_reset(XXH32_state_t *state_in,U32 seed)

{
  XXH_istate32_t *state;
  U32 seed_local;
  XXH32_state_t *state_in_local;
  
  *(U32 *)(state_in->ll + 1) = seed;
  *(U32 *)((long)state_in->ll + 0xc) = seed + 0x24234428;
  *(U32 *)(state_in->ll + 2) = seed + 0x85ebca77;
  *(U32 *)((long)state_in->ll + 0x14) = seed;
  *(U32 *)(state_in->ll + 3) = seed + 0x61c8864f;
  state_in->ll[0] = 0;
  *(undefined4 *)((long)state_in->ll + 0x1c) = 0;
  return XXH_OK;
}

Assistant:

XXH_errorcode XXH32_reset(XXH32_state_t *state_in, U32 seed) {
    XXH_istate32_t *state = (XXH_istate32_t *) state_in;
    state->seed = seed;
    state->v1 = seed + PRIME32_1 + PRIME32_2;
    state->v2 = seed + PRIME32_2;
    state->v3 = seed + 0;
    state->v4 = seed - PRIME32_1;
    state->total_len = 0;
    state->memsize = 0;
    return XXH_OK;
}